

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O1

void ncnn::resize_bilinear_font(uchar *font_bitmap,uchar *resized_font_bitmap,int fontpixelsize)

{
  long lVar1;
  int iVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  uint uVar35;
  byte bVar36;
  int *piVar37;
  long lVar38;
  uint uVar39;
  void *pvVar40;
  long lVar41;
  byte *pbVar42;
  long lVar43;
  undefined1 (*pauVar44) [16];
  uchar *puVar45;
  byte *pbVar46;
  uchar *puVar47;
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 (*pauVar51) [16];
  undefined1 (*pauVar52) [16];
  short *psVar53;
  byte bVar54;
  byte bVar55;
  uint uVar56;
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  uint uVar59;
  int iVar60;
  uint uVar61;
  undefined1 (*pauVar62) [16];
  int iVar63;
  undefined1 (*pauVar64) [16];
  ulong __n;
  bool bVar65;
  uint uVar66;
  float fVar67;
  float fVar68;
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  long local_120;
  float fStack_114;
  float fStack_f4;
  Mat local_c8;
  Mat local_78;
  
  uVar35 = fontpixelsize * 2;
  __n = (ulong)uVar35;
  uVar57 = 0xffffffffffffffff;
  if (-1 < fontpixelsize) {
    uVar57 = (long)(fontpixelsize * 6) << 2;
  }
  pvVar40 = operator_new__(uVar57);
  lVar41 = (long)fontpixelsize;
  lVar1 = (long)(int)uVar35 * 4 + lVar41 * 4;
  uVar57 = (ulong)(uint)fontpixelsize;
  if (0 < fontpixelsize) {
    uVar49 = 0;
    do {
      dVar69 = ((double)(int)uVar49 + 0.5) * (20.0 / (double)fontpixelsize) + -0.5;
      fVar67 = (float)dVar69;
      fVar68 = floorf(fVar67);
      fStack_114 = (float)((ulong)dVar69 >> 0x20);
      *(int *)((long)pvVar40 + uVar49 * 4) = (int)fVar68;
      fVar67 = (fVar67 - (float)(int)fVar68) * 2048.0;
      uVar66 = -(uint)(0.0 <= 2048.0 - fVar67);
      auVar70._0_4_ = (int)((float)(uVar66 & 0x3f000000 | ~uVar66 & 0xbf000000) + (2048.0 - fVar67))
      ;
      auVar70._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar67) & 0x3f000000 | ~-(uint)(0.0 <= fVar67) & 0xbf000000)
                + fVar67);
      auVar70._8_4_ = 0;
      auVar70._12_4_ = (int)(fStack_114 + 0.0);
      auVar70 = packssdw(auVar70,auVar70);
      *(int *)((long)pvVar40 + uVar49 * 4 + lVar1) = auVar70._0_4_;
      uVar49 = uVar49 + 1;
    } while (uVar57 != uVar49);
  }
  psVar53 = (short *)((long)pvVar40 + lVar41 * 4 + lVar1);
  if (0 < fontpixelsize) {
    uVar49 = 1;
    if (1 < (int)uVar35) {
      uVar49 = __n;
    }
    uVar50 = 0;
    do {
      dVar69 = ((double)(int)uVar50 + 0.5) * (20.0 / (double)fontpixelsize) + -0.5;
      fVar67 = (float)dVar69;
      fVar68 = floorf(fVar67);
      fStack_f4 = (float)((ulong)dVar69 >> 0x20);
      *(int *)((long)pvVar40 + uVar50 * 4 + lVar41 * 4) = (int)fVar68;
      fVar67 = (fVar67 - (float)(int)fVar68) * 2048.0;
      uVar66 = -(uint)(0.0 <= 2048.0 - fVar67);
      auVar75._0_4_ = (int)((float)(uVar66 & 0x3f000000 | ~uVar66 & 0xbf000000) + (2048.0 - fVar67))
      ;
      auVar75._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar67) & 0x3f000000 | ~-(uint)(0.0 <= fVar67) & 0xbf000000)
                + fVar67);
      auVar75._8_4_ = 0;
      auVar75._12_4_ = (int)(fStack_f4 + 0.0);
      auVar70 = packssdw(auVar75,auVar75);
      *(int *)(psVar53 + uVar50 * 2) = auVar70._0_4_;
      uVar50 = uVar50 + 1;
    } while (uVar49 != uVar50);
  }
  local_c8.cstep = 0;
  local_c8.data = (undefined1 (*) [16])0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,fontpixelsize,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (undefined1 (*) [16])0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,fontpixelsize,2,(Allocator *)0x0);
  pauVar44 = (undefined1 (*) [16])local_78.data;
  pauVar52 = (undefined1 (*) [16])local_c8.data;
  if (0 < fontpixelsize) {
    memset(local_78.data,0,__n);
    lVar1 = (long)(int)uVar35 * 4 + lVar41 * 4;
    lVar38 = lVar1 + 2;
    iVar48 = 0;
    iVar60 = -2;
    do {
      iVar2 = *(int *)((long)pvVar40 + (long)iVar48 * 4 + lVar41 * 4);
      pauVar58 = pauVar44;
      pauVar62 = pauVar52;
      if (iVar2 != iVar60) {
        iVar63 = iVar2 * 10;
        if (iVar2 == iVar60 + 1) {
          pauVar58 = pauVar52;
          pauVar62 = pauVar44;
          if (iVar2 < 0x27) {
            pbVar42 = font_bitmap + (iVar63 + 10);
            uVar49 = 0;
            do {
              uVar66 = *(uint *)((long)pvVar40 + uVar49 * 4);
              if ((int)uVar66 < 0) {
                bVar54 = *pbVar42 & 0xf;
                uVar39 = 0;
              }
              else if ((int)uVar66 < 0x13) {
                uVar50 = (ulong)(uVar66 >> 1);
                bVar54 = pbVar42[uVar50] >> 4;
                if ((uVar66 & 1) == 0) {
                  bVar54 = pbVar42[uVar50] & 0xf;
                }
                uVar39 = (uint)bVar54;
                if ((uVar66 & 1) == 0) {
                  bVar54 = pbVar42[uVar50] >> 4;
                }
                else {
                  bVar54 = pbVar42[uVar50 + 1] & 0xf;
                }
              }
              else {
                uVar39 = (uint)(pbVar42[9] >> 4);
                bVar54 = 0;
              }
              uVar66 = (uint)bVar54 * (int)*(short *)((long)pvVar40 + uVar49 * 4 + lVar38) +
                       uVar39 * (int)*(short *)((long)pvVar40 + uVar49 * 4 + lVar1);
              *(short *)(*pauVar52 + uVar49 * 2) = (short)(uVar66 >> 4) + (short)uVar66;
              uVar49 = uVar49 + 1;
            } while (uVar57 != uVar49);
          }
          else {
            memset(pauVar52,0,__n);
          }
        }
        else {
          pbVar42 = font_bitmap + iVar63;
          lVar43 = (long)iVar63 + 1;
          if (iVar2 < 0x27) {
            pbVar46 = font_bitmap + (iVar63 + 10);
            uVar49 = 0;
            do {
              uVar66 = *(uint *)((long)pvVar40 + uVar49 * 4);
              if ((int)uVar66 < 0) {
                bVar55 = *pbVar42 & 0xf;
                uVar66 = (uint)(*pbVar46 & 0xf);
                uVar39 = 0;
                bVar54 = 0;
              }
              else if ((int)uVar66 < 0x13) {
                bVar54 = pbVar42[uVar66 >> 1] >> 4;
                if ((uVar66 & 1) == 0) {
                  bVar54 = pbVar42[uVar66 >> 1] & 0xf;
                }
                if ((uVar66 & 1) == 0) {
                  bVar55 = pbVar42[uVar66 >> 1] >> 4;
                }
                else {
                  bVar55 = font_bitmap[(ulong)(uVar66 >> 1) + lVar43] & 0xf;
                }
                bVar65 = (uVar66 & 1) != 0;
                bVar36 = pbVar46[uVar66 >> 1] >> 4;
                if (!bVar65) {
                  bVar36 = pbVar46[uVar66 >> 1] & 0xf;
                }
                uVar39 = (uint)bVar36;
                if (bVar65) {
                  uVar66 = (uint)(pbVar46[(ulong)(uVar66 >> 1) + 1] & 0xf);
                }
                else {
                  uVar66 = (uint)(pbVar46[uVar66 >> 1] >> 4);
                }
              }
              else {
                bVar54 = pbVar42[9] >> 4;
                uVar39 = (uint)(pbVar46[9] >> 4);
                uVar66 = 0;
                bVar55 = 0;
              }
              iVar60 = (int)*(short *)((long)pvVar40 + uVar49 * 4 + lVar1);
              iVar63 = (int)*(short *)((long)pvVar40 + uVar49 * 4 + lVar38);
              uVar56 = (uint)bVar55 * iVar63 + (uint)bVar54 * iVar60;
              *(short *)(*pauVar52 + uVar49 * 2) = (short)(uVar56 >> 4) + (short)uVar56;
              uVar66 = uVar66 * iVar63 + uVar39 * iVar60;
              *(short *)(*pauVar44 + uVar49 * 2) = (short)(uVar66 >> 4) + (short)uVar66;
              uVar49 = uVar49 + 1;
            } while (uVar57 != uVar49);
          }
          else {
            uVar49 = 0;
            do {
              uVar66 = *(uint *)((long)pvVar40 + uVar49 * 4);
              if ((int)uVar66 < 0) {
                bVar55 = *pbVar42 & 0xf;
                bVar54 = 0;
              }
              else if ((int)uVar66 < 0x13) {
                uVar50 = (ulong)(uVar66 >> 1);
                bVar54 = pbVar42[uVar50] >> 4;
                if ((uVar66 & 1) == 0) {
                  bVar54 = pbVar42[uVar50] & 0xf;
                }
                if ((uVar66 & 1) == 0) {
                  bVar55 = pbVar42[uVar50] >> 4;
                }
                else {
                  bVar55 = font_bitmap[uVar50 + lVar43] & 0xf;
                }
              }
              else {
                bVar54 = pbVar42[9] >> 4;
                bVar55 = 0;
              }
              uVar66 = (uint)bVar55 * (int)*(short *)((long)pvVar40 + uVar49 * 4 + lVar38) +
                       (uint)bVar54 * (int)*(short *)((long)pvVar40 + uVar49 * 4 + lVar1);
              *(short *)(*pauVar52 + uVar49 * 2) = (short)(uVar66 >> 4) + (short)uVar66;
              *(undefined2 *)(*pauVar44 + uVar49 * 2) = 0;
              uVar49 = uVar49 + 1;
            } while (uVar57 != uVar49);
          }
        }
      }
      pauVar44 = pauVar58;
      iVar60 = iVar48 + 1;
      if ((iVar60 < (int)uVar35) &&
         (*(int *)((long)pvVar40 + (long)iVar60 * 4 + lVar41 * 4) == iVar2)) {
        puVar45 = resized_font_bitmap + iVar48 * fontpixelsize;
        puVar47 = resized_font_bitmap + iVar60 * fontpixelsize;
        uVar39 = (uint)*psVar53;
        uVar56 = (uint)psVar53[1];
        uVar59 = (uint)psVar53[2];
        uVar61 = (uint)psVar53[3];
        auVar70 = pshuflw(ZEXT416(uVar39),ZEXT416(uVar39),0);
        auVar71._0_4_ = auVar70._0_4_;
        auVar71._4_4_ = auVar71._0_4_;
        auVar71._8_4_ = auVar71._0_4_;
        auVar71._12_4_ = auVar71._0_4_;
        auVar70 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
        auVar72._0_4_ = auVar70._0_4_;
        auVar72._4_4_ = auVar72._0_4_;
        auVar72._8_4_ = auVar72._0_4_;
        auVar72._12_4_ = auVar72._0_4_;
        auVar70 = pshuflw(ZEXT416(uVar59),ZEXT416(uVar59),0);
        auVar73._0_4_ = auVar70._0_4_;
        auVar73._4_4_ = auVar73._0_4_;
        auVar73._8_4_ = auVar73._0_4_;
        auVar73._12_4_ = auVar73._0_4_;
        auVar70 = pshuflw(ZEXT416(uVar61),ZEXT416(uVar61),0);
        auVar74._0_4_ = auVar70._0_4_;
        auVar74._4_4_ = auVar74._0_4_;
        auVar74._8_4_ = auVar74._0_4_;
        auVar74._12_4_ = auVar74._0_4_;
        pauVar52 = pauVar62;
        pauVar58 = pauVar44;
        uVar66 = 0;
        if (0xf < fontpixelsize) {
          iVar48 = 0xf;
          do {
            auVar83 = pmulhw(*pauVar52,auVar71);
            auVar78 = pmulhw(*pauVar58,auVar72);
            auVar84 = pmulhw(pauVar52[1],auVar71);
            auVar85 = pmulhw(pauVar58[1],auVar72);
            auVar80 = pmulhw(*pauVar52,auVar73);
            auVar70 = pmulhw(*pauVar58,auVar74);
            auVar82 = pmulhw(pauVar52[1],auVar73);
            auVar75 = pmulhw(pauVar58[1],auVar74);
            auVar79._0_2_ = auVar78._0_2_ + auVar83._0_2_ + 2;
            auVar79._2_2_ = auVar78._2_2_ + auVar83._2_2_ + 2;
            auVar79._4_2_ = auVar78._4_2_ + auVar83._4_2_ + 2;
            auVar79._6_2_ = auVar78._6_2_ + auVar83._6_2_ + 2;
            auVar79._8_2_ = auVar78._8_2_ + auVar83._8_2_ + 2;
            auVar79._10_2_ = auVar78._10_2_ + auVar83._10_2_ + 2;
            auVar79._12_2_ = auVar78._12_2_ + auVar83._12_2_ + 2;
            auVar79._14_2_ = auVar78._14_2_ + auVar83._14_2_ + 2;
            auVar78 = psraw(auVar79,2);
            auVar86._0_2_ = auVar85._0_2_ + auVar84._0_2_ + 2;
            auVar86._2_2_ = auVar85._2_2_ + auVar84._2_2_ + 2;
            auVar86._4_2_ = auVar85._4_2_ + auVar84._4_2_ + 2;
            auVar86._6_2_ = auVar85._6_2_ + auVar84._6_2_ + 2;
            auVar86._8_2_ = auVar85._8_2_ + auVar84._8_2_ + 2;
            auVar86._10_2_ = auVar85._10_2_ + auVar84._10_2_ + 2;
            auVar86._12_2_ = auVar85._12_2_ + auVar84._12_2_ + 2;
            auVar86._14_2_ = auVar85._14_2_ + auVar84._14_2_ + 2;
            auVar83 = psraw(auVar86,2);
            sVar3 = auVar78._0_2_;
            sVar5 = auVar78._2_2_;
            sVar7 = auVar78._4_2_;
            sVar9 = auVar78._6_2_;
            sVar11 = auVar78._8_2_;
            sVar13 = auVar78._10_2_;
            sVar15 = auVar78._12_2_;
            sVar17 = auVar78._14_2_;
            sVar19 = auVar83._0_2_;
            sVar21 = auVar83._2_2_;
            sVar23 = auVar83._4_2_;
            sVar25 = auVar83._6_2_;
            sVar27 = auVar83._8_2_;
            sVar29 = auVar83._10_2_;
            sVar31 = auVar83._12_2_;
            sVar33 = auVar83._14_2_;
            auVar85._0_2_ = auVar70._0_2_ + auVar80._0_2_ + 2;
            auVar85._2_2_ = auVar70._2_2_ + auVar80._2_2_ + 2;
            auVar85._4_2_ = auVar70._4_2_ + auVar80._4_2_ + 2;
            auVar85._6_2_ = auVar70._6_2_ + auVar80._6_2_ + 2;
            auVar85._8_2_ = auVar70._8_2_ + auVar80._8_2_ + 2;
            auVar85._10_2_ = auVar70._10_2_ + auVar80._10_2_ + 2;
            auVar85._12_2_ = auVar70._12_2_ + auVar80._12_2_ + 2;
            auVar85._14_2_ = auVar70._14_2_ + auVar80._14_2_ + 2;
            auVar70 = psraw(auVar85,2);
            auVar76._0_2_ = auVar75._0_2_ + auVar82._0_2_ + 2;
            auVar76._2_2_ = auVar75._2_2_ + auVar82._2_2_ + 2;
            auVar76._4_2_ = auVar75._4_2_ + auVar82._4_2_ + 2;
            auVar76._6_2_ = auVar75._6_2_ + auVar82._6_2_ + 2;
            auVar76._8_2_ = auVar75._8_2_ + auVar82._8_2_ + 2;
            auVar76._10_2_ = auVar75._10_2_ + auVar82._10_2_ + 2;
            auVar76._12_2_ = auVar75._12_2_ + auVar82._12_2_ + 2;
            auVar76._14_2_ = auVar75._14_2_ + auVar82._14_2_ + 2;
            auVar75 = psraw(auVar76,2);
            sVar4 = auVar70._0_2_;
            sVar6 = auVar70._2_2_;
            sVar8 = auVar70._4_2_;
            sVar10 = auVar70._6_2_;
            sVar12 = auVar70._8_2_;
            sVar14 = auVar70._10_2_;
            sVar16 = auVar70._12_2_;
            sVar18 = auVar70._14_2_;
            sVar20 = auVar75._0_2_;
            sVar22 = auVar75._2_2_;
            sVar24 = auVar75._4_2_;
            sVar26 = auVar75._6_2_;
            sVar28 = auVar75._8_2_;
            sVar30 = auVar75._10_2_;
            sVar32 = auVar75._12_2_;
            sVar34 = auVar75._14_2_;
            *puVar45 = (0 < sVar3) * (sVar3 < 0x100) * auVar78[0] - (0xff < sVar3);
            puVar45[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar78[2] - (0xff < sVar5);
            puVar45[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar78[4] - (0xff < sVar7);
            puVar45[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar78[6] - (0xff < sVar9);
            puVar45[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar78[8] - (0xff < sVar11);
            puVar45[5] = (0 < sVar13) * (sVar13 < 0x100) * auVar78[10] - (0xff < sVar13);
            puVar45[6] = (0 < sVar15) * (sVar15 < 0x100) * auVar78[0xc] - (0xff < sVar15);
            puVar45[7] = (0 < sVar17) * (sVar17 < 0x100) * auVar78[0xe] - (0xff < sVar17);
            puVar45[8] = (0 < sVar19) * (sVar19 < 0x100) * auVar83[0] - (0xff < sVar19);
            puVar45[9] = (0 < sVar21) * (sVar21 < 0x100) * auVar83[2] - (0xff < sVar21);
            puVar45[10] = (0 < sVar23) * (sVar23 < 0x100) * auVar83[4] - (0xff < sVar23);
            puVar45[0xb] = (0 < sVar25) * (sVar25 < 0x100) * auVar83[6] - (0xff < sVar25);
            puVar45[0xc] = (0 < sVar27) * (sVar27 < 0x100) * auVar83[8] - (0xff < sVar27);
            puVar45[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar83[10] - (0xff < sVar29);
            puVar45[0xe] = (0 < sVar31) * (sVar31 < 0x100) * auVar83[0xc] - (0xff < sVar31);
            puVar45[0xf] = (0 < sVar33) * (sVar33 < 0x100) * auVar83[0xe] - (0xff < sVar33);
            *puVar47 = (0 < sVar4) * (sVar4 < 0x100) * auVar70[0] - (0xff < sVar4);
            puVar47[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar70[2] - (0xff < sVar6);
            puVar47[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8);
            puVar47[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar70[6] - (0xff < sVar10);
            puVar47[4] = (0 < sVar12) * (sVar12 < 0x100) * auVar70[8] - (0xff < sVar12);
            puVar47[5] = (0 < sVar14) * (sVar14 < 0x100) * auVar70[10] - (0xff < sVar14);
            puVar47[6] = (0 < sVar16) * (sVar16 < 0x100) * auVar70[0xc] - (0xff < sVar16);
            puVar47[7] = (0 < sVar18) * (sVar18 < 0x100) * auVar70[0xe] - (0xff < sVar18);
            puVar47[8] = (0 < sVar20) * (sVar20 < 0x100) * auVar75[0] - (0xff < sVar20);
            puVar47[9] = (0 < sVar22) * (sVar22 < 0x100) * auVar75[2] - (0xff < sVar22);
            puVar47[10] = (0 < sVar24) * (sVar24 < 0x100) * auVar75[4] - (0xff < sVar24);
            puVar47[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar75[6] - (0xff < sVar26);
            puVar47[0xc] = (0 < sVar28) * (sVar28 < 0x100) * auVar75[8] - (0xff < sVar28);
            puVar47[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar75[10] - (0xff < sVar30);
            puVar47[0xe] = (0 < sVar32) * (sVar32 < 0x100) * auVar75[0xc] - (0xff < sVar32);
            puVar47[0xf] = (0 < sVar34) * (sVar34 < 0x100) * auVar75[0xe] - (0xff < sVar34);
            puVar45 = puVar45 + 0x10;
            puVar47 = puVar47 + 0x10;
            pauVar52 = pauVar52 + 2;
            pauVar58 = pauVar58 + 2;
            iVar48 = iVar48 + 0x10;
            uVar66 = fontpixelsize & 0x7ffffff0U;
          } while (iVar48 < fontpixelsize);
        }
        if ((int)(uVar66 | 7) < fontpixelsize) {
          lVar43 = 0;
          pauVar51 = pauVar52;
          pauVar64 = pauVar58;
          do {
            auVar78 = pmulhw(*(undefined1 (*) [16])(*pauVar52 + lVar43 * 2),auVar71);
            auVar80 = pmulhw(*(undefined1 (*) [16])(*pauVar58 + lVar43 * 2),auVar72);
            auVar70 = pmulhw(*(undefined1 (*) [16])(*pauVar52 + lVar43 * 2),auVar73);
            auVar75 = pmulhw(*(undefined1 (*) [16])(*pauVar58 + lVar43 * 2),auVar74);
            auVar81._0_2_ = auVar80._0_2_ + auVar78._0_2_ + 2;
            auVar81._2_2_ = auVar80._2_2_ + auVar78._2_2_ + 2;
            auVar81._4_2_ = auVar80._4_2_ + auVar78._4_2_ + 2;
            auVar81._6_2_ = auVar80._6_2_ + auVar78._6_2_ + 2;
            auVar81._8_2_ = auVar80._8_2_ + auVar78._8_2_ + 2;
            auVar81._10_2_ = auVar80._10_2_ + auVar78._10_2_ + 2;
            auVar81._12_2_ = auVar80._12_2_ + auVar78._12_2_ + 2;
            auVar81._14_2_ = auVar80._14_2_ + auVar78._14_2_ + 2;
            auVar78 = psraw(auVar81,2);
            sVar3 = auVar78._0_2_;
            sVar5 = auVar78._2_2_;
            sVar7 = auVar78._4_2_;
            sVar9 = auVar78._6_2_;
            sVar11 = auVar78._8_2_;
            sVar13 = auVar78._10_2_;
            sVar15 = auVar78._12_2_;
            sVar17 = auVar78._14_2_;
            auVar77._0_2_ = auVar75._0_2_ + auVar70._0_2_ + 2;
            auVar77._2_2_ = auVar75._2_2_ + auVar70._2_2_ + 2;
            auVar77._4_2_ = auVar75._4_2_ + auVar70._4_2_ + 2;
            auVar77._6_2_ = auVar75._6_2_ + auVar70._6_2_ + 2;
            auVar77._8_2_ = auVar75._8_2_ + auVar70._8_2_ + 2;
            auVar77._10_2_ = auVar75._10_2_ + auVar70._10_2_ + 2;
            auVar77._12_2_ = auVar75._12_2_ + auVar70._12_2_ + 2;
            auVar77._14_2_ = auVar75._14_2_ + auVar70._14_2_ + 2;
            auVar70 = psraw(auVar77,2);
            sVar4 = auVar70._0_2_;
            sVar6 = auVar70._2_2_;
            sVar8 = auVar70._4_2_;
            sVar10 = auVar70._6_2_;
            sVar12 = auVar70._8_2_;
            sVar14 = auVar70._10_2_;
            sVar16 = auVar70._12_2_;
            sVar18 = auVar70._14_2_;
            *(ulong *)(puVar45 + lVar43) =
                 CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar78[0xe] - (0xff < sVar17),
                          CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar78[0xc] - (0xff < sVar15),
                                   CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar78[10] -
                                            (0xff < sVar13),
                                            CONCAT14((0 < sVar11) * (sVar11 < 0x100) * auVar78[8] -
                                                     (0xff < sVar11),
                                                     CONCAT13((0 < sVar9) * (sVar9 < 0x100) *
                                                              auVar78[6] - (0xff < sVar9),
                                                              CONCAT12((0 < sVar7) * (sVar7 < 0x100)
                                                                       * auVar78[4] - (0xff < sVar7)
                                                                       ,CONCAT11((0 < sVar5) *
                                                                                 (sVar5 < 0x100) *
                                                                                 auVar78[2] -
                                                                                 (0xff < sVar5),
                                                                                 (0 < sVar3) *
                                                                                 (sVar3 < 0x100) *
                                                                                 auVar78[0] -
                                                                                 (0xff < sVar3))))))
                                  ));
            *(ulong *)(puVar47 + lVar43) =
                 CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar70[0xe] - (0xff < sVar18),
                          CONCAT16((0 < sVar16) * (sVar16 < 0x100) * auVar70[0xc] - (0xff < sVar16),
                                   CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar70[10] -
                                            (0xff < sVar14),
                                            CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar70[8] -
                                                     (0xff < sVar12),
                                                     CONCAT13((0 < sVar10) * (sVar10 < 0x100) *
                                                              auVar70[6] - (0xff < sVar10),
                                                              CONCAT12((0 < sVar8) * (sVar8 < 0x100)
                                                                       * auVar70[4] - (0xff < sVar8)
                                                                       ,CONCAT11((0 < sVar6) *
                                                                                 (sVar6 < 0x100) *
                                                                                 auVar70[2] -
                                                                                 (0xff < sVar6),
                                                                                 (0 < sVar4) *
                                                                                 (sVar4 < 0x100) *
                                                                                 auVar70[0] -
                                                                                 (0xff < sVar4))))))
                                  ));
            pauVar51 = pauVar51 + 1;
            pauVar64 = pauVar64 + 1;
            lVar43 = lVar43 + 8;
          } while ((int)((int)lVar43 + uVar66 + 7) < fontpixelsize);
          puVar45 = puVar45 + lVar43;
          puVar47 = puVar47 + lVar43;
          uVar66 = uVar66 + (int)lVar43;
          pauVar52 = pauVar51;
          pauVar58 = pauVar64;
        }
        local_120 = 8;
        if ((int)uVar66 < fontpixelsize) {
          lVar43 = 0;
          do {
            sVar3 = *(short *)(*pauVar52 + lVar43 * 2);
            sVar4 = *(short *)(*pauVar58 + lVar43 * 2);
            puVar45[lVar43] =
                 (uchar)(((int)sVar3 * uVar39 >> 0x10) + ((int)sVar4 * uVar56 >> 0x10) + 2 >> 2);
            puVar47[lVar43] =
                 (uchar)(((int)sVar4 * uVar61 >> 0x10) + ((int)sVar3 * uVar59 >> 0x10) + 2 >> 2);
            lVar43 = lVar43 + 1;
          } while (fontpixelsize - uVar66 != (int)lVar43);
        }
      }
      else {
        puVar45 = resized_font_bitmap + iVar48 * fontpixelsize;
        uVar39 = (uint)*psVar53;
        uVar56 = (uint)psVar53[1];
        auVar70 = pshuflw(ZEXT416(uVar39),ZEXT416(uVar39),0);
        auVar78._0_4_ = auVar70._0_4_;
        auVar78._4_4_ = auVar78._0_4_;
        auVar78._8_4_ = auVar78._0_4_;
        auVar78._12_4_ = auVar78._0_4_;
        auVar70 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
        auVar80._0_4_ = auVar70._0_4_;
        auVar80._4_4_ = auVar80._0_4_;
        auVar80._8_4_ = auVar80._0_4_;
        auVar80._12_4_ = auVar80._0_4_;
        pauVar52 = pauVar62;
        pauVar58 = pauVar44;
        uVar66 = 0;
        if (0xf < fontpixelsize) {
          iVar60 = 0xf;
          do {
            auVar70 = pmulhw(*pauVar52,auVar78);
            auVar82 = pmulhw(*pauVar58,auVar80);
            auVar75 = pmulhw(pauVar52[1],auVar78);
            auVar84 = pmulhw(pauVar58[1],auVar80);
            auVar83._0_2_ = auVar82._0_2_ + auVar70._0_2_ + 2;
            auVar83._2_2_ = auVar82._2_2_ + auVar70._2_2_ + 2;
            auVar83._4_2_ = auVar82._4_2_ + auVar70._4_2_ + 2;
            auVar83._6_2_ = auVar82._6_2_ + auVar70._6_2_ + 2;
            auVar83._8_2_ = auVar82._8_2_ + auVar70._8_2_ + 2;
            auVar83._10_2_ = auVar82._10_2_ + auVar70._10_2_ + 2;
            auVar83._12_2_ = auVar82._12_2_ + auVar70._12_2_ + 2;
            auVar83._14_2_ = auVar82._14_2_ + auVar70._14_2_ + 2;
            auVar70 = psraw(auVar83,2);
            auVar82._0_2_ = auVar84._0_2_ + auVar75._0_2_ + 2;
            auVar82._2_2_ = auVar84._2_2_ + auVar75._2_2_ + 2;
            auVar82._4_2_ = auVar84._4_2_ + auVar75._4_2_ + 2;
            auVar82._6_2_ = auVar84._6_2_ + auVar75._6_2_ + 2;
            auVar82._8_2_ = auVar84._8_2_ + auVar75._8_2_ + 2;
            auVar82._10_2_ = auVar84._10_2_ + auVar75._10_2_ + 2;
            auVar82._12_2_ = auVar84._12_2_ + auVar75._12_2_ + 2;
            auVar82._14_2_ = auVar84._14_2_ + auVar75._14_2_ + 2;
            auVar75 = psraw(auVar82,2);
            sVar3 = auVar70._0_2_;
            sVar4 = auVar70._2_2_;
            sVar5 = auVar70._4_2_;
            sVar6 = auVar70._6_2_;
            sVar7 = auVar70._8_2_;
            sVar8 = auVar70._10_2_;
            sVar9 = auVar70._12_2_;
            sVar10 = auVar70._14_2_;
            sVar11 = auVar75._0_2_;
            sVar12 = auVar75._2_2_;
            sVar13 = auVar75._4_2_;
            sVar14 = auVar75._6_2_;
            sVar15 = auVar75._8_2_;
            sVar16 = auVar75._10_2_;
            sVar17 = auVar75._12_2_;
            sVar18 = auVar75._14_2_;
            *puVar45 = (0 < sVar3) * (sVar3 < 0x100) * auVar70[0] - (0xff < sVar3);
            puVar45[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar70[2] - (0xff < sVar4);
            puVar45[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar70[4] - (0xff < sVar5);
            puVar45[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar70[6] - (0xff < sVar6);
            puVar45[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar70[8] - (0xff < sVar7);
            puVar45[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar70[10] - (0xff < sVar8);
            puVar45[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar70[0xc] - (0xff < sVar9);
            puVar45[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar70[0xe] - (0xff < sVar10);
            puVar45[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar75[0] - (0xff < sVar11);
            puVar45[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar75[2] - (0xff < sVar12);
            puVar45[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar75[4] - (0xff < sVar13);
            puVar45[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar75[6] - (0xff < sVar14);
            puVar45[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar75[8] - (0xff < sVar15);
            puVar45[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar75[10] - (0xff < sVar16);
            puVar45[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar75[0xc] - (0xff < sVar17);
            puVar45[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar75[0xe] - (0xff < sVar18);
            puVar45 = puVar45 + 0x10;
            pauVar52 = pauVar52 + 2;
            pauVar58 = pauVar58 + 2;
            iVar60 = iVar60 + 0x10;
            uVar66 = fontpixelsize & 0x7ffffff0U;
          } while (iVar60 < fontpixelsize);
        }
        uVar59 = uVar66 | 7;
        while ((int)uVar59 < fontpixelsize) {
          auVar70 = pmulhw(*pauVar52,auVar78);
          auVar75 = pmulhw(*pauVar58,auVar80);
          auVar84._0_2_ = auVar75._0_2_ + auVar70._0_2_ + 2;
          auVar84._2_2_ = auVar75._2_2_ + auVar70._2_2_ + 2;
          auVar84._4_2_ = auVar75._4_2_ + auVar70._4_2_ + 2;
          auVar84._6_2_ = auVar75._6_2_ + auVar70._6_2_ + 2;
          auVar84._8_2_ = auVar75._8_2_ + auVar70._8_2_ + 2;
          auVar84._10_2_ = auVar75._10_2_ + auVar70._10_2_ + 2;
          auVar84._12_2_ = auVar75._12_2_ + auVar70._12_2_ + 2;
          auVar84._14_2_ = auVar75._14_2_ + auVar70._14_2_ + 2;
          auVar70 = psraw(auVar84,2);
          sVar3 = auVar70._0_2_;
          sVar4 = auVar70._2_2_;
          sVar5 = auVar70._4_2_;
          sVar6 = auVar70._6_2_;
          sVar7 = auVar70._8_2_;
          sVar8 = auVar70._10_2_;
          sVar9 = auVar70._12_2_;
          sVar10 = auVar70._14_2_;
          *(ulong *)puVar45 =
               CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar70[0xe] - (0xff < sVar10),
                        CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar70[0xc] - (0xff < sVar9),
                                 CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar70[10] -
                                          (0xff < sVar8),
                                          CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar70[8] -
                                                   (0xff < sVar7),
                                                   CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                            auVar70[6] - (0xff < sVar6),
                                                            CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                     auVar70[4] - (0xff < sVar5),
                                                                     CONCAT11((0 < sVar4) *
                                                                              (sVar4 < 0x100) *
                                                                              auVar70[2] -
                                                                              (0xff < sVar4),
                                                                              (0 < sVar3) *
                                                                              (sVar3 < 0x100) *
                                                                              auVar70[0] -
                                                                              (0xff < sVar3))))))));
          puVar45 = puVar45 + 8;
          pauVar52 = pauVar52 + 1;
          pauVar58 = pauVar58 + 1;
          uVar59 = uVar66 + 0xf;
          uVar66 = uVar66 + 8;
        }
        local_120 = 4;
        iVar60 = iVar48;
        if ((int)uVar66 < fontpixelsize) {
          lVar43 = 0;
          do {
            puVar45[lVar43] =
                 (uchar)(((int)*(short *)(*pauVar52 + lVar43 * 2) * uVar39 >> 0x10) +
                         ((int)*(short *)(*pauVar58 + lVar43 * 2) * uVar56 >> 0x10) + 2 >> 2);
            lVar43 = lVar43 + 1;
          } while (fontpixelsize - uVar66 != (int)lVar43);
        }
      }
      psVar53 = (short *)((long)psVar53 + local_120);
      iVar48 = iVar60 + 1;
      pauVar52 = pauVar62;
      iVar60 = iVar2;
    } while (iVar48 < (int)uVar35);
  }
  operator_delete__(pvVar40);
  piVar37 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_78.data != (undefined1 (*) [16])0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  piVar37 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_c8.data != (undefined1 (*) [16])0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_font(const unsigned char* font_bitmap, unsigned char* resized_font_bitmap, int fontpixelsize)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    const int srcw = 20;
    const int srch = 40;
    const int w = fontpixelsize;
    const int h = fontpixelsize * 2;

    double scale = (double)srcw / w;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        xofs[dx] = sx;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w, (size_t)2u);
    Mat rowsbuf1(w, (size_t)2u);
    short* rows0 = (short*)rowsbuf0;
    short* rows1 = (short*)rowsbuf1;

    {
        short* rows1p = rows1;
        for (int dx = 0; dx < w; dx++)
        {
            rows1p[dx] = 0;
        }
    }

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    rows1p[dx] = 0;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = font_bitmap + 10 * (sy);
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = 0;

                    ialphap += 2;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;
                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            short b0 = ibeta[0];
            short b1 = ibeta[1];
            short b2 = ibeta[2];
            short b3 = ibeta[3];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp0 = resized_font_bitmap + w * (dy);
            unsigned char* Dp1 = resized_font_bitmap + w * (dy + 1);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            int16x8_t _b2 = vdupq_n_s16(b2);
            int16x8_t _b3 = vdupq_n_s16(b3);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc00 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc01 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                int16x8_t _acc10 = vaddq_s16(vqdmulhq_s16(_r00, _b2), vqdmulhq_s16(_r10, _b3));
                int16x8_t _acc11 = vaddq_s16(vqdmulhq_s16(_r01, _b2), vqdmulhq_s16(_r11, _b3));
                uint8x16_t _Dp0 = vcombine_u8(vqrshrun_n_s16(_acc00, 3), vqrshrun_n_s16(_acc01, 3));
                uint8x16_t _Dp1 = vcombine_u8(vqrshrun_n_s16(_acc10, 3), vqrshrun_n_s16(_acc11, 3));
                vst1q_u8(Dp0, _Dp0);
                vst1q_u8(Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r0, _b2), vqdmulhq_s16(_r1, _b3));
                uint8x8_t _Dp0 = vqrshrun_n_s16(_acc0, 3);
                uint8x8_t _Dp1 = vqrshrun_n_s16(_acc1, 3);
                vst1_u8(Dp0, _Dp0);
                vst1_u8(Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _b2 = _mm_set1_epi16(b2);
            __m128i _b3 = _mm_set1_epi16(b3);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc00 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc01 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                __m128i _acc10 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b2), _mm_mulhi_epi16(_r10, _b3));
                __m128i _acc11 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b2), _mm_mulhi_epi16(_r11, _b3));
                _acc00 = _mm_srai_epi16(_mm_add_epi16(_acc00, _v2), 2);
                _acc01 = _mm_srai_epi16(_mm_add_epi16(_acc01, _v2), 2);
                _acc10 = _mm_srai_epi16(_mm_add_epi16(_acc10, _v2), 2);
                _acc11 = _mm_srai_epi16(_mm_add_epi16(_acc11, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc00, _acc01);
                __m128i _Dp1 = _mm_packus_epi16(_acc10, _acc11);
                _mm_storeu_si128((__m128i*)Dp0, _Dp0);
                _mm_storeu_si128((__m128i*)Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b2), _mm_mulhi_epi16(_r1, _b3));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc0, _acc0);
                __m128i _Dp1 = _mm_packus_epi16(_acc1, _acc1);
                _mm_storel_epi64((__m128i*)Dp0, _Dp0);
                _mm_storel_epi64((__m128i*)Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp0++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
                *Dp1++ = (unsigned char)(((short)((b2 * s0) >> 16) + (short)((b3 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            short b0 = ibeta[0];
            short b1 = ibeta[1];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp = resized_font_bitmap + w * (dy);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                uint8x16_t _Dp = vcombine_u8(vqrshrun_n_s16(_acc0, 3), vqrshrun_n_s16(_acc1, 3));
                vst1q_u8(Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                uint8x8_t _Dp = vqrshrun_n_s16(_acc, 3);
                vst1_u8(Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc0, _acc1);
                _mm_storeu_si128((__m128i*)Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                _acc = _mm_srai_epi16(_mm_add_epi16(_acc, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc, _acc);
                _mm_storel_epi64((__m128i*)Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 2;
        }
    }

    delete[] buf;
}